

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_affixutils.cpp
# Opt level: O0

UnicodeString *
icu_63::number::impl::AffixUtils::replaceType
          (UnicodeString *__return_storage_ptr__,UnicodeString *affixPattern,AffixPatternType type,
          char16_t replacementChar,UErrorCode *status)

{
  bool bVar1;
  UBool UVar2;
  int32_t iVar3;
  UErrorCode *status_00;
  AffixTag AVar4;
  AffixUtils *pAStack_58;
  AffixTag tag;
  UErrorCode *status_local;
  char16_t replacementChar_local;
  AffixPatternType type_local;
  UnicodeString *affixPattern_local;
  UnicodeString *output;
  
  status_00 = status;
  UnicodeString::UnicodeString(__return_storage_ptr__,affixPattern);
  iVar3 = UnicodeString::length(affixPattern);
  if (iVar3 != 0) {
    AffixTag::AffixTag((AffixTag *)&pAStack_58);
    while (bVar1 = hasNext((AffixTag *)&pAStack_58,affixPattern), bVar1) {
      AVar4._8_8_ = affixPattern;
      AVar4.offset = tag.offset;
      AVar4.codePoint = tag.codePoint;
      AVar4 = nextToken(pAStack_58,AVar4,(UnicodeString *)status,status_00);
      tag._0_8_ = AVar4._8_8_;
      pAStack_58 = AVar4._0_8_;
      UVar2 = ::U_FAILURE(*status);
      if (UVar2 != '\0') {
        return __return_storage_ptr__;
      }
      if (tag.codePoint == type) {
        UnicodeString::replace(__return_storage_ptr__,(int)pAStack_58 + -1,1,replacementChar);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString AffixUtils::replaceType(const UnicodeString &affixPattern, AffixPatternType type,
                                      char16_t replacementChar, UErrorCode &status) {
    UnicodeString output(affixPattern); // copy
    if (affixPattern.length() == 0) {
        return output;
    };
    AffixTag tag;
    while (hasNext(tag, affixPattern)) {
        tag = nextToken(tag, affixPattern, status);
        if (U_FAILURE(status)) { return output; }
        if (tag.type == type) {
            output.replace(tag.offset - 1, 1, replacementChar);
        }
    }
    return output;
}